

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionFilter.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::ArgumentListParser::parse_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,void *this,istream *is)

{
  char cVar1;
  char *in_RCX;
  string word;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = cali::util::read_char(is);
  if (cVar1 == '(') {
    do {
      cali::util::read_word_abi_cxx11_(&local_50,(util *)is,(istream *)",()",in_RCX);
      if (local_50._M_string_length != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
      }
      cVar1 = cali::util::read_char(is);
      std::__cxx11::string::~string((string *)&local_50);
    } while (((*(char *)((long)this + 0x20) == '\0') && (cVar1 == ',')) &&
            (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0));
    if (cVar1 != ')') {
      *(undefined1 *)((long)this + 0x20) = 1;
      std::__cxx11::string::assign((char *)this);
    }
  }
  else {
    std::istream::unget();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> parse(std::istream& is)
    {
        std::vector<std::string> ret;
        char                     c = util::read_char(is);

        if (c != '(') {
            is.unget();
            return ret;
        }

        do {
            std::string word = util::read_word(is, ",()");

            if (!word.empty())
                ret.emplace_back(std::move(word));

            c = util::read_char(is);
        } while (!m_error && is.good() && c == ',');

        if (c != ')') {
            m_error     = true;
            m_error_msg = "missing \')\'";
        }

        return ret;
    }